

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void int_linear_dom(vec<int> *a,vec<IntVar_*> *x,int c)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  vec<int> *elem;
  int in_EDX;
  vec<IntVar_*> *in_RSI;
  vec<int> *in_RDI;
  vec<vec<int>_> *in_stack_00000078;
  vec<IntVar_*> *in_stack_00000080;
  int k;
  int j;
  int i_1;
  vec<vec<int>_> t;
  uint i;
  vec<vec<int>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  IntVar **in_stack_ffffffffffffff18;
  IntVar *in_stack_ffffffffffffff20;
  int local_40;
  int local_2c;
  vec<vec<int>_> local_28;
  uint local_18;
  int local_14;
  vec<IntVar_*> *local_10;
  vec<int> *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; uVar3 = local_18, uVar6 = vec<IntVar_*>::size(local_10), uVar3 < uVar6;
      local_18 = local_18 + 1) {
    vec<IntVar_*>::operator[](local_10,local_18);
    IntVar::specialiseToEL((IntVar *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  }
  vec<vec<int>_>::vec(&local_28);
  vec<IntVar_*>::operator[](local_10,0);
  local_2c = IntVar::getMin((IntVar *)0x2613a6);
  while( true ) {
    vec<IntVar_*>::operator[](local_10,0);
    iVar7 = IntVar::getMax((IntVar *)0x2613f4);
    if (iVar7 < local_2c) break;
    vec<IntVar_*>::operator[](local_10,0);
    bVar4 = IntVar::indomain(in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18);
    if (bVar4) {
      vec<IntVar_*>::operator[](local_10,1);
      local_40 = IntVar::getMin((IntVar *)0x2614b1);
      while( true ) {
        vec<IntVar_*>::operator[](local_10,1);
        iVar7 = IntVar::getMax((IntVar *)0x2614f9);
        if (iVar7 < local_40) break;
        vec<IntVar_*>::operator[](local_10,1);
        bVar4 = IntVar::indomain(in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18);
        iVar7 = local_14;
        if (bVar4) {
          piVar8 = vec<int>::operator[](local_8,0);
          iVar1 = *piVar8;
          piVar8 = vec<int>::operator[](local_8,1);
          iVar2 = *piVar8;
          piVar8 = vec<int>::operator[](local_8,2);
          if (((iVar7 - iVar1 * local_2c) + iVar2 * local_40) % *piVar8 == 0) {
            in_stack_ffffffffffffff20 = (IntVar *)vec<int>::operator[](local_8,2);
            in_stack_ffffffffffffff18 = vec<IntVar_*>::operator[](local_10,2);
            uVar5 = IntVar::indomain(in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18);
            if ((bool)uVar5) {
              vec<vec<int>_>::push(in_stack_ffffffffffffff00);
              elem = vec<vec<int>_>::last(&local_28);
              vec<int>::push((vec<int> *)CONCAT17(uVar5,in_stack_ffffffffffffff10),(int *)elem);
              in_stack_ffffffffffffff00 = (vec<vec<int>_> *)vec<vec<int>_>::last(&local_28);
              vec<int>::push((vec<int> *)CONCAT17(uVar5,in_stack_ffffffffffffff10),(int *)elem);
              vec<vec<int>_>::last(&local_28);
              vec<int>::push((vec<int> *)CONCAT17(uVar5,in_stack_ffffffffffffff10),(int *)elem);
            }
          }
        }
        local_40 = local_40 + 1;
      }
    }
    local_2c = local_2c + 1;
  }
  table_GAC(in_stack_00000080,in_stack_00000078);
  vec<vec<int>_>::~vec(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void int_linear_dom(vec<int>& a, vec<IntVar*>& x, int c) {
	assert(a.size() == 3 && x.size() == 3);

	for (unsigned int i = 0; i < x.size(); i++) {
		x[i]->specialiseToEL();
	}

	vec<vec<int> > t;
	for (int i = x[0]->getMin(); i <= x[0]->getMax(); i++) {
		if (!x[0]->indomain(i)) {
			continue;
		}
		for (int j = x[1]->getMin(); j <= x[1]->getMax(); j++) {
			if (!x[1]->indomain(j)) {
				continue;
			}
			int k = c - a[0] * i + a[1] * j;
			if (k % a[2] != 0) {
				continue;
			}
			k /= a[2];
			if (!x[2]->indomain(k)) {
				continue;
			}
			t.push();
			t.last().push(i);
			t.last().push(j);
			t.last().push(k);
		}
	}

	table_GAC(x, t);
}